

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

void xatlas::DestroyOutputMeshes(Context *ctx)

{
  Mesh *pMVar1;
  Mesh *ptr;
  char *in_RCX;
  int in_EDX;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int in_R8D;
  long lVar2;
  uint32_t j;
  ulong uVar3;
  int i;
  long lVar4;
  
  if ((ctx->atlas).meshes != (Mesh *)0x0) {
    for (lVar4 = 0; ptr = (ctx->atlas).meshes, lVar4 < (int)(ctx->atlas).meshCount;
        lVar4 = lVar4 + 1) {
      pMVar1 = ptr + lVar4;
      if (ptr[lVar4].chartArray != (Chart *)0x0) {
        lVar2 = 0;
        for (uVar3 = 0; uVar3 < pMVar1->chartCount; uVar3 = uVar3 + 1) {
          if (*(long *)((long)&pMVar1->chartArray->faceArray + lVar2) != 0) {
            if (internal::s_free == (undefined *)0x0) {
              (*(code *)internal::s_realloc)();
              in_EDX = extraout_EDX_00;
            }
            else {
              (*(code *)internal::s_free)();
              in_EDX = extraout_EDX;
            }
          }
          lVar2 = lVar2 + 0x18;
        }
        internal::Realloc(pMVar1->chartArray,0,in_EDX,in_RCX,in_R8D);
        in_EDX = extraout_EDX_01;
      }
      if (pMVar1->vertexArray != (Vertex *)0x0) {
        if (internal::s_free == (undefined *)0x0) {
          (*(code *)internal::s_realloc)();
          in_EDX = extraout_EDX_03;
        }
        else {
          (*(code *)internal::s_free)();
          in_EDX = extraout_EDX_02;
        }
      }
      if (pMVar1->indexArray != (uint32_t *)0x0) {
        if (internal::s_free == (undefined *)0x0) {
          (*(code *)internal::s_realloc)();
          in_EDX = extraout_EDX_05;
        }
        else {
          (*(code *)internal::s_free)();
          in_EDX = extraout_EDX_04;
        }
      }
    }
    internal::Realloc(ptr,0,in_EDX,in_RCX,in_R8D);
    (ctx->atlas).meshes = (Mesh *)0x0;
  }
  return;
}

Assistant:

static void DestroyOutputMeshes(Context *ctx)
{
	if (!ctx->atlas.meshes)
		return;
	for (int i = 0; i < (int)ctx->atlas.meshCount; i++) {
		Mesh &mesh = ctx->atlas.meshes[i];
		if (mesh.chartArray) {
			for (uint32_t j = 0; j < mesh.chartCount; j++) {
				if (mesh.chartArray[j].faceArray)
					XA_FREE(mesh.chartArray[j].faceArray);
			}
			XA_FREE(mesh.chartArray);
		}
		if (mesh.vertexArray)
			XA_FREE(mesh.vertexArray);
		if (mesh.indexArray)
			XA_FREE(mesh.indexArray);
	}
	XA_FREE(ctx->atlas.meshes);
	ctx->atlas.meshes = nullptr;
}